

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<float> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  float fVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  pointer ppVar4;
  int n_00;
  quadratic_cost_type<float> *this_00;
  pointer ppVar5;
  pointer ppVar6;
  undefined8 extraout_RAX;
  ulong uVar7;
  pointer ppVar8;
  pointer ppVar9;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_float>
  __aurng;
  float fVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> r;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
  q;
  allocator_type local_71;
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_70;
  int local_54;
  quadratic_cost_type<float> *local_50;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
  local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            (&local_70,(long)n,(allocator_type *)&local_48);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
  ::vector(&local_48,
           (long)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[n],&local_71);
  ppVar6 = local_70.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = local_70.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (n != 0) {
    pfVar2 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    uVar7 = 0;
    do {
      local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7].first = pfVar2[uVar7];
      local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar7].second = (int)uVar7;
      uVar7 = uVar7 + 1;
    } while ((uint)n != uVar7);
  }
  ppVar9 = local_70.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  n_00 = n;
  this_00 = this;
  if (local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_54 = n;
    local_50 = this;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_70.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_70.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_70.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_70.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar4,ppVar6);
    ppVar4 = local_70.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar9 = local_70.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar6 = local_70.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    n_00 = local_54;
    this_00 = local_50;
  }
  for (; ppVar5 = local_70.
                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, local_54 = n_00, local_50 = this_00,
      ppVar4 != local_70.
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppVar4 = ppVar4 + 1) {
    fVar1 = ppVar4->first;
    fVar10 = ppVar9->first;
    if (((fVar1 != fVar10) ||
        (ppVar8 = ppVar9,
        local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppVar6, NAN(fVar1) || NAN(fVar10))) &&
       (ppVar8 = ppVar4,
       local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_finish = ppVar6, 8 < (long)ppVar4 - (long)ppVar9)) {
      do {
        auVar11._0_4_ =
             std::
             generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (rng);
        auVar11._4_60_ = extraout_var;
        auVar3 = vfmadd213ss_fma(auVar11._0_16_,ZEXT416((uint)(fVar1 - fVar10)),
                                 ZEXT416((uint)fVar10));
        ppVar9->first = auVar3._0_4_;
        ppVar9 = ppVar9 + 1;
      } while (ppVar9 != ppVar4);
    }
    ppVar9 = ppVar8;
    ppVar6 = local_70.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    n_00 = local_54;
    this_00 = local_50;
    local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  if (8 < (long)local_70.
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppVar9) {
    if ((long)ppVar9 -
        (long)local_70.
              super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      fVar1 = ppVar9->first;
      fVar10 = fVar1 + 1.0;
      if ((fVar1 == fVar10) && (!NAN(fVar1) && !NAN(fVar10))) goto LAB_00154591;
      if (ppVar9 != local_70.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = ppVar6;
        do {
          auVar13._0_4_ =
               std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar13._4_60_ = extraout_var_01;
          auVar3 = vfmadd213ss_fma(auVar13._0_16_,ZEXT416((uint)(fVar10 - fVar1)),
                                   ZEXT416((uint)fVar1));
          ppVar9->first = auVar3._0_4_;
          ppVar9 = ppVar9 + 1;
          ppVar6 = local_70.
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar9 != ppVar5);
      }
    }
    else {
      local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppVar6;
      fVar10 = linearize<long,float>
                         (0,(local_70.
                             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first,
                          (long)ppVar9 -
                          (long)local_70.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3,ppVar9->first,
                          (long)ppVar6 -
                          (long)local_70.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3);
      fVar1 = ppVar9->first;
      if ((fVar1 == fVar10) && (!NAN(fVar1) && !NAN(fVar10))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_00154591:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_70.
            super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.
                                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      ppVar6 = local_70.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (ppVar9 != ppVar5) {
        do {
          auVar12._0_4_ =
               std::
               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar12._4_60_ = extraout_var_00;
          auVar3 = vfmadd213ss_fma(auVar12._0_16_,ZEXT416((uint)(fVar10 - fVar1)),
                                   ZEXT416((uint)fVar1));
          ppVar9->first = auVar3._0_4_;
          ppVar9 = ppVar9 + 1;
          ppVar6 = local_70.
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (ppVar9 != ppVar5);
      }
    }
  }
  local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar6;
  ppVar4 = local_70.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_70.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_70.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_70.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_70.
                                  super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar4,local_70.
                      super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (n_00 != 0) {
    pfVar2 = (this_00->linear_elements)._M_t.
             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    uVar7 = 0;
    do {
      pfVar2[uVar7] =
           local_70.
           super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar7].first;
      uVar7 = uVar7 + 1;
    } while ((uint)n != uVar7);
  }
  make_loo_norm(this_00,n_00);
  if (local_48.
      super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<float>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }